

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

bool __thiscall jsonnet::internal::SortImports::groupEndsAfter(SortImports *this,Local *local)

{
  pointer pFVar1;
  bool bVar2;
  Local *ast_;
  AST *pAVar3;
  FodderElement *fodderElem;
  pointer pFVar4;
  bool bVar5;
  bool bVar6;
  
  ast_ = goodLocalOrNull(this,local->body);
  if (ast_ == (Local *)0x0) {
    bVar2 = true;
  }
  else {
    pAVar3 = left_recursive_deep(&ast_->super_AST);
    pFVar4 = (pAVar3->openFodder).
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pFVar1 = (pAVar3->openFodder).
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar4 == pFVar1) {
      bVar2 = false;
    }
    else {
      bVar5 = false;
      do {
        bVar6 = pFVar4->blanks != 0;
        bVar2 = (bool)(bVar6 | bVar5);
        if (bVar6 || bVar5) {
          return bVar2;
        }
        if (pFVar4->kind != INTERSTITIAL) {
          bVar5 = true;
        }
        pFVar4 = pFVar4 + 1;
      } while (pFVar4 != pFVar1);
    }
  }
  return bVar2;
}

Assistant:

bool groupEndsAfter(Local *local)
    {
        Local *next = goodLocalOrNull(local->body);
        if (!next) {
            return true;
        }

        bool newlineReached = false;
        for (const auto &fodderElem : open_fodder(next)) {
            if (newlineReached || fodderElem.blanks > 0) {
                return true;
            }
            if (fodderElem.kind != FodderElement::Kind::INTERSTITIAL) {
                newlineReached = true;
            }
        }
        return false;
    }